

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O0

void describe_game(char *buf,nh_log_status status,nh_game_info *gi)

{
  char *pcVar1;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *mode_desc [4];
  nh_game_info *gi_local;
  nh_log_status status_local;
  char *buf_local;
  
  mode_desc[3] = (char *)gi;
  mode_desc[1] = "\t[explore]";
  mode_desc[2] = "\t[wizard]";
  uStack_58 = 0x124222;
  uStack_54 = 0;
  mode_desc[0]._0_4_ = 0x128cb0;
  mode_desc[0]._4_4_ = 0;
  switch(status) {
  case LS_SAVED:
    pcVar1 = "";
    if (gi->has_amulet != '\0') {
      pcVar1 = " with the amulet";
    }
    snprintf(buf,0x100,"%s\t%3.3s-%3.3s-%3.3s-%3.3s %s%s\tafter %d moves%s",gi->name,gi->plrole,
             gi->plrace,gi->plgend,gi->plalign,gi->level_desc,pcVar1,
             CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),gi->moves),
             *(undefined8 *)(&uStack_58 + (ulong)gi->playmode * 2));
    break;
  case LS_DONE:
    snprintf(buf,0x100,"%s\t%3.3s-%3.3s-%3.3s-%3.3s %s\tafter %d moves%s",gi->name,gi->plrole,
             gi->plrace,gi->plgend,gi->plalign,gi->death,
             CONCAT44((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),gi->moves),
             *(undefined8 *)(&uStack_58 + (ulong)gi->playmode * 2));
    break;
  case LS_IN_PROGRESS:
    snprintf(buf,0x100,"    %s\t%3.3s-%3.3s-%3.3s-%3.3s  (in progress)\t%s",gi->name,gi->plrole,
             gi->plrace,gi->plgend,gi->plalign,*(undefined8 *)(&uStack_58 + (ulong)gi->playmode * 2)
            );
    break;
  case LS_CRASHED:
    snprintf(buf,0x100,"%s\t%3.3s-%3.3s-%3.3s-%3.3s  (crashed)\t%s",gi->name,gi->plrole,gi->plrace,
             gi->plgend,gi->plalign,*(undefined8 *)(&uStack_58 + (ulong)gi->playmode * 2));
    break;
  default:
    *buf = '\0';
  }
  return;
}

Assistant:

void describe_game(char *buf, enum nh_log_status status, struct nh_game_info *gi)
{
    const char *mode_desc[] = {"", "\t[tutorial]", "\t[explore]", "\t[wizard]"};
    switch (status) {
	case LS_CRASHED:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s  (crashed)\t%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    mode_desc[gi->playmode]);
	    break;
	    
	case LS_IN_PROGRESS:
	    snprintf(buf, BUFSZ, "    %s\t%3.3s-%3.3s-%3.3s-%3.3s  (in progress)\t%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    mode_desc[gi->playmode]);
	    break;
	    
	case LS_SAVED:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s%s\tafter %d moves%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    gi->level_desc, gi->has_amulet ? " with the amulet" : "",
		    gi->moves, mode_desc[gi->playmode]);
	    break;
	    
	case LS_DONE:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s\tafter %d moves%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    gi->death, gi->moves, mode_desc[gi->playmode]);
	    break;
	    
	    
	default:
	    buf[0] = '\0';
	    break;
    }
}